

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::verifySubroutineUniformValues
          (FunctionalTest16 *this,_test_case *test_case,uint *n_id,
          _subroutine_uniform_value_verification *verification)

{
  uint uVar1;
  uint n_stage;
  long lVar2;
  _shader_stage *local_48 [4];
  _program *local_28;
  
  uVar1 = *n_id;
  if (*test_case == TEST_CASE_FIRST) {
    local_28 = this->m_po_descriptors + uVar1;
    local_48[0] = &this->m_po_descriptors[uVar1].vertex;
    local_48[1] = &this->m_po_descriptors[uVar1].tess_control;
    local_48[2] = &this->m_po_descriptors[uVar1].tess_evaluation;
    local_48[3] = &this->m_po_descriptors[uVar1].geometry;
  }
  else {
    local_48[0] = this->m_vs_po_descriptors + uVar1;
    local_48[1] = this->m_tc_po_descriptors + uVar1;
    local_48[2] = this->m_te_po_descriptors + uVar1;
    local_48[3] = this->m_gs_po_descriptors + uVar1;
    local_28 = (_program *)(this->m_fs_po_descriptors + uVar1);
  }
  lVar2 = 0;
  do {
    verifySubroutineUniformValuesForShaderStage(this,local_48[lVar2],verification);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

void FunctionalTest16::verifySubroutineUniformValues(const _test_case& test_case, const unsigned int& n_id,
													 const _subroutine_uniform_value_verification& verification)
{
	const _shader_stage* stages[] = {
		DE_NULL, /* fragment shader     stage slot */
		DE_NULL, /* geometry shader     stage slot */
		DE_NULL, /* tess control shader stage slot */
		DE_NULL, /* tess eval shader    stage slot */
		DE_NULL  /* vertex shader       stage slot */
	};
	const unsigned int n_stages = sizeof(stages) / sizeof(stages[0]);

	/* Verify that currently reported subroutine uniform values are equal to default values */
	getShaderStages(test_case == TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT, n_id, stages);

	for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
	{
		const _shader_stage& current_stage = *(stages[n_stage]);

		verifySubroutineUniformValuesForShaderStage(current_stage, verification);
	} /* for (all items) */
}